

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsModuleEvaluation(JsModuleRecord requestModule,JsValueRef *result)

{
  ScriptContext *scriptContext;
  bool bVar1;
  int iVar2;
  SourceTextModuleRecord *pSVar3;
  JsrtContext *context;
  JsrtContext *context_00;
  undefined4 extraout_var;
  JsErrorCode JVar4;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  SmartFPUControlT<true> local_40;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar4 = JsErrorInvalidArgument;
  if ((requestModule != (JsModuleRecord)0x0) && (*(int *)((long)requestModule + 8) == 0x65646f4d)) {
    pSVar3 = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (result != (JsValueRef *)0x0) {
      *result = (JsValueRef)0x0;
    }
    context = (JsrtContext *)
              Js::JavascriptLibrary::GetJsrtContext
                        ((((pSVar3->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary)
    ;
    context_00 = JsrtContext::GetCurrent();
    scriptContext =
         (((context->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                        ExceptionType_OutOfMemory);
    bVar1 = JsrtContext::TrySetCurrent(context);
    JVar4 = JsErrorWrongThread;
    if (bVar1) {
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_a0,scriptContext,
                 (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                 &stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(scriptContext,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
      SmartFPUControlT<true>::SmartFPUControlT(&local_40);
      JVar4 = JsErrorBadFPUState;
      if (local_40.m_err == 0) {
        iVar2 = (*(pSVar3->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xc])(pSVar3);
        JVar4 = JsNoError;
        if (result != (JsValueRef *)0x0) {
          *result = (JsValueRef)CONCAT44(extraout_var,iVar2);
          JVar4 = JsNoError;
        }
      }
      SmartFPUControlT<true>::~SmartFPUControlT(&local_40);
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    JsrtContext::TrySetCurrent(context_00);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  }
  return JVar4;
}

Assistant:

CHAKRA_API
JsModuleEvaluation(
    _In_ JsModuleRecord requestModule,
    _Outptr_result_maybenull_ JsValueRef* result)
{
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (result != nullptr)
    {
        *result = JS_INVALID_REFERENCE;
    }
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        SmartFPUControl smartFpuControl;
        if (smartFpuControl.HasErr())
        {
            return JsErrorBadFPUState;
        }
        JsValueRef returnRef = moduleRecord->ModuleEvaluation();
        if (result != nullptr)
        {
            *result = returnRef;
        }
        return JsNoError;
    });
    return errorCode;
}